

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  vec<3,_float,_(glm::qualifier)0> vVar1;
  vec<3,_float,_(glm::qualifier)0> local_110;
  vec<3,_float,_(glm::qualifier)0> local_100;
  vec<3,_float,_(glm::qualifier)0> local_f0;
  vec<3,_float,_(glm::qualifier)0> local_e0;
  vec<3,_float,_(glm::qualifier)0> local_d0;
  vec<3,_float,_(glm::qualifier)0> local_c4;
  vec<3,_float,_(glm::qualifier)0> local_b8;
  vec<3,_float,_(glm::qualifier)0> local_a8;
  vec<3,_float,_(glm::qualifier)0> local_98;
  vec<3,_float,_(glm::qualifier)0> local_88;
  vec<3,_float,_(glm::qualifier)0> local_78;
  vec<3,_float,_(glm::qualifier)0> local_6c;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec<3,_float,_(glm::qualifier)0> local_4c;
  vec<3,_float,_(glm::qualifier)0> local_40;
  vec<3,_float,_(glm::qualifier)0> local_2c;
  int local_20;
  int local_1c;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    cameraSpeed = deltaTime * 500.0;
    if (key == 0x20) {
      if (curMotion == PAUSE) {
        curMotion = motionBeforePause;
      }
      else {
        motionBeforePause = curMotion;
        curMotion = PAUSE;
      }
    }
    else if (key == 0x31) {
      curMotion = ONE;
    }
    else if (key == 0x32) {
      curMotion = TWO;
    }
    else if (key == 0x33) {
      curMotion = THREE;
    }
    else if (key == 0x34) {
      curMotion = FOUR;
    }
    else if (key == 0x35) {
      curMotion = FIVE;
    }
    else if (key == 0x36) {
      curMotion = SIX;
    }
    else if (key == 0x37) {
      curMotion = SEVEN;
    }
    else if (key == 0x38) {
      bingoFlag = 0;
      cur_passed_time = passed_time;
      curMotion = EIGHT;
    }
    else if (key == 0x39) {
      curMotion = NINE;
    }
    else {
      local_20 = mods;
      local_1c = action;
      mods_local = scancode;
      action_local = key;
      _scancode_local = window;
      if (key == 0x41) {
        vVar1 = glm::cross<float,(glm::qualifier)0>(&cameraFront,&cameraUp);
        local_98.field_2 = vVar1.field_2;
        local_88.field_2 = local_98.field_2;
        local_98._0_8_ = vVar1._0_8_;
        local_88.field_0 = local_98.field_0;
        local_88.field_1 = local_98.field_1;
        local_98 = vVar1;
        vVar1 = glm::normalize<3,float,(glm::qualifier)0>(&local_88);
        local_a8.field_2 = vVar1.field_2;
        local_78.field_2 = local_a8.field_2;
        local_a8._0_8_ = vVar1._0_8_;
        local_78.field_0 = local_a8.field_0;
        local_78.field_1 = local_a8.field_1;
        local_a8 = vVar1;
        vVar1 = glm::operator*(&local_78,cameraSpeed);
        local_b8._0_8_ = vVar1._0_8_;
        local_6c.field_0 = local_b8.field_0;
        local_6c.field_1 = local_b8.field_1;
        local_b8.field_2 = vVar1.field_2;
        local_6c.field_2 = local_b8.field_2;
        local_b8 = vVar1;
        glm::vec<3,float,(glm::qualifier)0>::operator+=
                  ((vec<3,float,(glm::qualifier)0> *)&cameraPos,&local_6c);
      }
      else if (key == 0x42) {
        bingoFlag = 0;
        cur_passed_time = passed_time;
        curMotion = BINGO;
      }
      else if (key == 0x44) {
        vVar1 = glm::cross<float,(glm::qualifier)0>(&cameraFront,&cameraUp);
        local_f0.field_2 = vVar1.field_2;
        local_e0.field_2 = local_f0.field_2;
        local_f0._0_8_ = vVar1._0_8_;
        local_e0.field_0 = local_f0.field_0;
        local_e0.field_1 = local_f0.field_1;
        vVar1 = glm::normalize<3,float,(glm::qualifier)0>(&local_e0);
        local_100.field_2 = vVar1.field_2;
        local_d0.field_2 = local_100.field_2;
        local_100._0_8_ = vVar1._0_8_;
        local_d0.field_0 = local_100.field_0;
        local_d0.field_1 = local_100.field_1;
        vVar1 = glm::operator*(&local_d0,cameraSpeed);
        local_110._0_8_ = vVar1._0_8_;
        local_c4.field_0 = local_110.field_0;
        local_c4.field_1 = local_110.field_1;
        local_110.field_2 = vVar1.field_2;
        local_c4.field_2 = local_110.field_2;
        glm::vec<3,float,(glm::qualifier)0>::operator-=
                  ((vec<3,float,(glm::qualifier)0> *)&cameraPos,&local_c4);
      }
      else if (key == 0x47) {
        curMotion = GRASP;
      }
      else if (key == 0x4f) {
        curMotion = OK;
      }
      else if (key == 0x53) {
        vVar1 = glm::operator*(cameraSpeed,&cameraUp);
        local_60._0_8_ = vVar1._0_8_;
        local_4c.field_0 = local_60.field_0;
        local_4c.field_1 = local_60.field_1;
        local_60.field_2 = vVar1.field_2;
        local_4c.field_2 = local_60.field_2;
        local_60 = vVar1;
        glm::vec<3,float,(glm::qualifier)0>::operator+=
                  ((vec<3,float,(glm::qualifier)0> *)&cameraPos,&local_4c);
      }
      else if (key == 0x55) {
        bingoFlag = 0;
        cur_passed_time = passed_time;
        curMotion = GUN;
      }
      else if (key == 0x56) {
        curMotion = WAVE;
      }
      else if (key == 0x57) {
        vVar1 = glm::operator*(cameraSpeed,&cameraUp);
        local_40._0_8_ = vVar1._0_8_;
        local_2c.field_0 = local_40.field_0;
        local_2c.field_1 = local_40.field_1;
        local_40.field_2 = vVar1.field_2;
        local_2c.field_2 = local_40.field_2;
        local_40 = vVar1;
        glm::vec<3,float,(glm::qualifier)0>::operator-=
                  ((vec<3,float,(glm::qualifier)0> *)&cameraPos,&local_2c);
      }
      else if (key == 0x100) {
        glfwSetWindowShouldClose(window,1);
      }
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow *window, int key, int scancode, int action, int mods) {
    if(action == GLFW_PRESS){
        cameraSpeed = 500.0f*deltaTime;
        switch(key){
            case GLFW_KEY_ESCAPE:
                glfwSetWindowShouldClose(window, GLFW_TRUE);
                break;
            case GLFW_KEY_W://图像向上
                cameraPos -= cameraSpeed * cameraUp;
                break;
            case GLFW_KEY_S://图像向下
                cameraPos += cameraSpeed * cameraUp;
                break;
            case GLFW_KEY_A://图像向左
                cameraPos += glm::normalize(glm::cross(cameraFront, cameraUp)) * cameraSpeed;
                break;
            case GLFW_KEY_D://图像向右
                cameraPos -= glm::normalize(glm::cross(cameraFront, cameraUp)) * cameraSpeed;
                break;
            case GLFW_KEY_G://GRASP
                curMotion = GRASP;
                break;
            case GLFW_KEY_V://WAVE
                curMotion = WAVE;
                break;
            case GLFW_KEY_O://OK
                curMotion = OK;
                break;
            case GLFW_KEY_B://BINGO
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = BINGO;
                break;
            case GLFW_KEY_U://GUN
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = GUN;
                break;
            case GLFW_KEY_1:
                curMotion = ONE;
                break;
            case GLFW_KEY_2:
                curMotion = TWO;
                break;
            case GLFW_KEY_3:
                curMotion = THREE;
                break;
            case GLFW_KEY_4:
                curMotion = FOUR;
                break;
            case GLFW_KEY_5:
                curMotion = FIVE;
                break;
            case GLFW_KEY_6:
                curMotion = SIX;
                break;
            case GLFW_KEY_7:
                curMotion = SEVEN;
                break;
            case GLFW_KEY_8:
                bingoFlag = 0;
                cur_passed_time = passed_time;
                curMotion = EIGHT;
                break;
            case GLFW_KEY_9:
                curMotion = NINE;
                break;
            case GLFW_KEY_SPACE:
                if(curMotion != PAUSE) {
                    motionBeforePause = curMotion;
                    curMotion = PAUSE;
                } else{
                    curMotion = motionBeforePause;
                }
            default:
                break;
        }
    }
}